

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O2

unsigned_long_long
el::base::utils::DateTime::getTimeDifference
          (timeval *endTime,timeval *startTime,TimestampUnit timestampUnit)

{
  if (timestampUnit != Microsecond) {
    return startTime->tv_usec / -1000 + endTime->tv_usec / 1000 +
           (endTime->tv_sec - startTime->tv_sec) * 1000;
  }
  return (endTime->tv_usec - startTime->tv_usec) + (endTime->tv_sec - startTime->tv_sec) * 1000000;
}

Assistant:

unsigned long long DateTime::getTimeDifference(const struct timeval& endTime, const struct timeval& startTime,
    base::TimestampUnit timestampUnit) {
  if (timestampUnit == base::TimestampUnit::Microsecond) {
    return static_cast<unsigned long long>(static_cast<unsigned long long>(1000000 * endTime.tv_sec + endTime.tv_usec) -
                                           static_cast<unsigned long long>(1000000 * startTime.tv_sec + startTime.tv_usec));
  }
  // milliseconds
  auto conv = [](const struct timeval& tim) {
    return static_cast<unsigned long long>((tim.tv_sec * 1000) + (tim.tv_usec / 1000));
  };
  return static_cast<unsigned long long>(conv(endTime) - conv(startTime));
}